

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O0

uint __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::PushElement<signed_char,unsigned_int>
          (FlatBufferBuilderImpl<false> *this,char element)

{
  type tVar1;
  char local_12;
  char local_11;
  FlatBufferBuilderImpl<false> *pFStack_10;
  char element_local;
  FlatBufferBuilderImpl<false> *this_local;
  
  local_11 = element;
  pFStack_10 = this;
  AssertScalarT<signed_char>(this);
  Align(this,1);
  local_12 = EndianScalar<signed_char>(local_11);
  vector_downward<unsigned_int>::push_small<signed_char>(&this->buf_,&local_12);
  tVar1 = CalculateOffset<unsigned_int>(this);
  return tVar1;
}

Assistant:

ReturnT PushElement(T element) {
    AssertScalarT<T>();
    Align(sizeof(T));
    buf_.push_small(EndianScalar(element));
    return CalculateOffset<ReturnT>();
  }